

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O3

vector<long_long,_std::allocator<long_long>_> *
multiplyPolynomialsNTT
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          vector<long_long,_std::allocator<long_long>_> *a,
          vector<long_long,_std::allocator<long_long>_> *b)

{
  long *plVar1;
  iterator __position;
  pointer plVar2;
  void *pvVar3;
  byte bVar4;
  bool bVar5;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  vector<long_long,_std::allocator<long_long>_> *pvVar10;
  ulong uVar11;
  pointer *this;
  size_type sVar12;
  size_type __new_size;
  long *plVar13;
  long lVar14;
  undefined1 auStack_98 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> v [2];
  unsigned_long_long local_38;
  
  uVar11 = (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  uVar9 = (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar9 < uVar11) {
    uVar9 = uVar11;
  }
  lVar14 = 0;
  do {
    bVar4 = (byte)lVar14;
    lVar14 = lVar14 + 1;
  } while ((ulong)(long)(1 << (bVar4 & 0x1f)) < uVar9);
  this = (pointer *)auStack_98;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar8 = 2 << (bVar4 & 0x1f);
  __new_size = (size_type)iVar8;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)b;
  bVar7 = true;
  do {
    bVar5 = bVar7;
    pvVar10 = (vector<long_long,_std::allocator<long_long>_> *)
              v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (bVar5) {
      pvVar10 = a;
    }
    plVar1 = (pvVar10->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar13 = (pvVar10->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start; plVar13 != plVar1; plVar13 = plVar13 + 1) {
      local_38 = (*plVar13 + 0xc0000001U) % 0xc0000001;
      __position._M_current = this[1];
      if (__position._M_current == this[2]) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>
                  ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        this[1] = __position._M_current + 1;
      }
    }
    local_38 = 0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,__new_size,
               &local_38);
    ntt((int)lVar14,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,false);
    this = &v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage;
    bVar7 = false;
  } while (bVar5);
  if (0 < iVar8) {
    sVar12 = 0;
    do {
      *(ulong *)((long)auStack_98 + sVar12 * 8) =
           (v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage[sVar12] *
           *(pointer)((long)auStack_98 + sVar12 * 8)) % 0xc0000001;
      sVar12 = sVar12 + 1;
    } while (__new_size != sVar12);
  }
  ntt((int)lVar14,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_98,true
     );
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (__return_storage_ptr__,__new_size,(allocator_type *)&local_38);
  puVar6 = inv2.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < iVar8) {
    plVar2 = (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar12 = 0;
    do {
      plVar2[sVar12] = (puVar6[lVar14] * *(pointer)((long)auStack_98 + sVar12 * 8)) % 0xc0000001;
      sVar12 = sVar12 + 1;
    } while (__new_size != sVar12);
  }
  lVar14 = 0x18;
  do {
    pvVar3 = *(void **)((long)v + lVar14 + -8);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

vector<ll> multiplyPolynomialsNTT(vector<ll> &a, vector<ll> &b) {
    int k = 0;
    while ((1 << k) < a.size() || (1 << k) < b.size()) k++;
    k++;
    
    vector<ull> v[2];
    rep(j, 0, 2) {
        for (auto x : (j ? b : a)) v[j].push_back((x + P) % P);
        v[j].resize(1 << k, 0);
        ntt(k, v[j], false);
    }
    
    rep(i, 0, 1 << k) v[0][i] = (v[0][i] * v[1][i]) % P;
    ntt(k, v[0], true);
    vector<ll> res(1 << k);
    rep(i, 0, 1 << k) res[i] = (v[0][i] * inv2[k]) % P;
    return res;
}